

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

string * __thiscall
flatbuffers::go::GoGenerator::NativeType_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,Type *type)

{
  BaseType BVar1;
  EnumDef *def;
  StructDef *def_00;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  string local_60;
  undefined1 local_40 [32];
  
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    if (type->enum_def != (EnumDef *)0x0) {
      GetEnumTypeName_abi_cxx11_(__return_storage_ptr__,this,type->enum_def);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                         (ulong)BVar1 * 8),(allocator<char> *)&local_60);
    return __return_storage_ptr__;
  }
  switch(BVar1) {
  case BASE_TYPE_STRING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"string","");
    return __return_storage_ptr__;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    local_40._0_4_ = type->element;
    local_40._24_2_ = type->fixed_length;
    local_40._4_4_ = BASE_TYPE_NONE;
    local_40._8_8_ = type->struct_def;
    local_40._16_8_ = type->enum_def;
    NativeType_abi_cxx11_(&local_60,this,(Type *)local_40);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x37bae0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001ffc66;
  case BASE_TYPE_STRUCT:
    def_00 = type->struct_def;
    (*(this->namer_).super_Namer._vptr_Namer[0x11])((string *)local_40,&this->namer_,def_00);
    WrapInNameSpaceAndTrack(&local_60,this,&def_00->super_Definition,(string *)local_40);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x36be0c);
    break;
  case BASE_TYPE_UNION:
    def = type->enum_def;
    (*(this->namer_).super_Namer._vptr_Namer[0x11])((string *)local_40,&this->namer_,def);
    WrapInNameSpaceAndTrack(&local_60,this,&def->super_Definition,(string *)local_40);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x36be0c);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_go.cpp"
                  ,0x5e5,"std::string flatbuffers::go::GoGenerator::NativeType(const Type &)");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,(ulong)(local_60.field_2._M_allocated_capacity + 1));
  }
  local_60._M_dataplus._M_p = (pointer)CONCAT44(local_40._4_4_,local_40._0_4_);
  local_60.field_2._M_allocated_capacity = local_40._16_8_;
  if (local_60._M_dataplus._M_p != local_40 + 0x10) {
LAB_001ffc66:
    operator_delete(local_60._M_dataplus._M_p,
                    (ulong)((long)&(((EnumDef *)local_60.field_2._M_allocated_capacity)->
                                   super_Definition).name._M_dataplus._M_p + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NativeType(const Type &type) {
    if (IsScalar(type.base_type)) {
      if (type.enum_def == nullptr) {
        return GenTypeBasic(type);
      } else {
        return GetEnumTypeName(*type.enum_def);
      }
    } else if (IsString(type)) {
      return "string";
    } else if (IsVector(type)) {
      return "[]" + NativeType(type.VectorType());
    } else if (type.base_type == BASE_TYPE_STRUCT) {
      return "*" + WrapInNameSpaceAndTrack(type.struct_def,
                                           NativeName(*type.struct_def));
    } else if (type.base_type == BASE_TYPE_UNION) {
      return "*" +
             WrapInNameSpaceAndTrack(type.enum_def, NativeName(*type.enum_def));
    }
    FLATBUFFERS_ASSERT(0);
    return std::string();
  }